

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListModel.cpp
# Opt level: O0

QVariant * __thiscall QColorListModel::data(QColorListModel *this,QModelIndex *index,int role)

{
  int iVar1;
  qsizetype qVar2;
  QColor *this_00;
  const_reference pQVar3;
  int in_ECX;
  QModelIndex *in_RDX;
  long in_RSI;
  QVariant *in_RDI;
  QSize *in_stack_00000028;
  QColor *in_stack_00000030;
  QString *in_stack_ffffffffffffff28;
  QColor *in_stack_ffffffffffffff30;
  qsizetype in_stack_ffffffffffffff38;
  QList<QString> *in_stack_ffffffffffffff40;
  QString *pQVar4;
  QString local_68;
  QSize local_40 [3];
  QIcon local_28;
  int local_1c;
  QModelIndex *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  iVar1 = QModelIndex::row(in_RDX);
  if (-1 < iVar1) {
    iVar1 = QModelIndex::row(local_18);
    qVar2 = QList<QString>::size((QList<QString> *)0x20842b);
    if (iVar1 < qVar2) {
      if (local_1c == 1) {
        QModelIndex::row(local_18);
        QList<QString>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        QColor::QColor(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        QSize::QSize(local_40,0x40,0x40);
        QtWidgetsExtraCache::cachedIconColor(in_stack_00000030,in_stack_00000028);
        QIcon::operator_cast_to_QVariant((QIcon *)in_RDI);
        QIcon::~QIcon(&local_28);
        return in_RDI;
      }
      if ((local_1c != 0) && (local_1c != 2)) {
        if (local_1c == 0x100) {
          QModelIndex::row(local_18);
          pQVar3 = QList<QString>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          QVariant::QVariant(in_RDI,pQVar3);
          return in_RDI;
        }
        QVariant::QVariant((QVariant *)0x20861b);
        return in_RDI;
      }
      this_00 = (QColor *)(*(long *)(in_RSI + 0x10) + 0x20);
      QModelIndex::row(local_18);
      QList<QString>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      QColor::QColor(this_00,in_stack_ffffffffffffff28);
      pQVar4 = &local_68;
      QColor::name((NameFormat)pQVar4);
      QVariant::QVariant(in_RDI,pQVar4);
      QString::~QString((QString *)0x2085a5);
      return in_RDI;
    }
  }
  QVariant::QVariant((QVariant *)0x208442);
  return in_RDI;
}

Assistant:

QVariant QColorListModel::data(const QModelIndex &index, int role) const {
    if (index.row() < 0 || index.row() >= d->colors.size()) {
        return QVariant();
    }

    if (role == Qt::DecorationRole) {
        return QtWidgetsExtraCache::cachedIconColor(QColor(d->colors.at(index.row())), QSize(64, 64));
    } else if (role == Qt::DisplayRole || role == Qt::EditRole) {
        return QColor(d->colors.at(index.row())).name(QColor::NameFormat(d->nameFormat));
    } else if (role == static_cast<int>(QColorListModel::Role::HexArgbName)) {
        return d->colors.at(index.row());
    }

    return QVariant();
}